

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O1

FunctionTableHolder * __thiscall
ImageTypeManager::functionTable(ImageTypeManager *this,uint8_t type)

{
  _Base_ptr p_Var1;
  imageException *this_00;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  bool bVar4;
  
  p_Var3 = &(this->_functionTableMap)._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = (this->_functionTableMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var3->_M_header;
  for (; p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[bVar4]) {
    bVar4 = (byte)(char)p_Var1[1]._M_color < type;
    if (!bVar4) {
      p_Var2 = p_Var1;
    }
  }
  p_Var1 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var3) &&
     (p_Var1 = p_Var2, type < (byte)(char)p_Var2[1]._M_color)) {
    p_Var1 = &p_Var3->_M_header;
  }
  if ((_Rb_tree_header *)p_Var1 != p_Var3) {
    return (FunctionTableHolder *)&p_Var1[1]._M_parent;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this_00,"Function table is not initialised");
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

Image RgbToBgr( FunctionTable::RgbToBgrForm4 rgbToBgr,
                    const Image & in )
    {
        Image_Function::ParameterValidation( in );

        Image out = in.generate( in.width(), in.height(), RGB );

        rgbToBgr( in, 0, 0, out, 0, 0, in.width(), in.height() );

        return out;
    }